

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalability_test.c
# Opt level: O2

int transact(nng_socket *clients,int num)

{
  int iVar1;
  nng_msg *in_RAX;
  ulong uVar2;
  nng_msg *local_38;
  nng_msg *msg;
  
  if (num < 1) {
    num = 0;
  }
  uVar2 = 0;
  local_38 = in_RAX;
  while ((((iVar1 = 0, (uint)num != uVar2 && (iVar1 = nng_msg_alloc(&local_38,0), iVar1 == 0)) &&
          (iVar1 = nng_sendmsg((nng_socket)clients[uVar2].id,local_38,0), iVar1 == 0)) &&
         (iVar1 = nng_recvmsg((nng_socket)clients[uVar2].id,&local_38,0), iVar1 == 0))) {
    nng_msg_free(local_38);
    local_38 = (nng_msg *)0x0;
    uVar2 = uVar2 + 1;
  }
  return iVar1;
}

Assistant:

int
transact(nng_socket *clients, int num)
{
	nng_msg *msg;
	int      rv = 0;
	int      i;

	for (i = 0; i < num; i++) {

		if (((rv = nng_msg_alloc(&msg, 0)) != 0) ||
		    ((rv = nng_sendmsg(clients[i], msg, 0)) != 0) ||
		    ((rv = nng_recvmsg(clients[i], &msg, 0)) != 0)) {
			// We may leak a message, but this is an
			// error case anyway.
			break;
		}
		nng_msg_free(msg);
		msg = NULL;
	}
	return (rv);
}